

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

bool __thiscall testing::internal::FilePath::IsDirectory(FilePath *this)

{
  size_type sVar1;
  long in_FS_OFFSET;
  bool bVar2;
  
  sVar1 = (this->pathname_)._M_string_length;
  if (sVar1 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = (this->pathname_)._M_dataplus._M_p[sVar1 - 1] == '/';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool FilePath::IsDirectory() const {
  return !pathname_.empty() &&
         IsPathSeparator(pathname_.c_str()[pathname_.length() - 1]);
}